

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_PC_StartLegacySyntaxSuccess_Test::
InterpreterTestSuite_PC_StartLegacySyntaxSuccess_Test
          (InterpreterTestSuite_PC_StartLegacySyntaxSuccess_Test *this)

{
  InterpreterTestSuite::InterpreterTestSuite(&this->super_InterpreterTestSuite);
  (this->super_InterpreterTestSuite).super_Test._vptr_Test = (_func_int **)&PTR__Test_0033bd48;
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_StartLegacySyntaxSuccess)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, Start(_, _, _)).Times(1).WillRepeatedly(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;
    expr  = ctx.mInterpreter.ParseExpression("start 127.0.0.1 20001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}